

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O1

int Disasm(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  UInt8 UVar3;
  int iVar4;
  
  InitVariables(pMyDisasm);
  AnalyzeOpcode(pMyDisasm);
  iVar4 = (pMyDisasm->Reserved_).ERROR_OPCODE;
  pMyDisasm->Error = iVar4;
  if ((pMyDisasm->Reserved_).OutOfBlock == 0) {
    if (iVar4 == -1) {
      BuildCompleteInstruction(pMyDisasm);
      iVar4 = -1;
    }
    else {
      FixOpSizeForMemoryOperand(pMyDisasm);
      (pMyDisasm->Prefix).REX.W_ = (pMyDisasm->Reserved_).REX.W_;
      UVar1 = (pMyDisasm->Reserved_).REX.X_;
      UVar2 = (pMyDisasm->Reserved_).REX.B_;
      UVar3 = (pMyDisasm->Reserved_).REX.state;
      (pMyDisasm->Prefix).REX.R_ = (pMyDisasm->Reserved_).REX.R_;
      (pMyDisasm->Prefix).REX.X_ = UVar1;
      (pMyDisasm->Prefix).REX.B_ = UVar2;
      (pMyDisasm->Prefix).REX.state = UVar3;
      FillSegmentsRegisters(pMyDisasm);
      if ((pMyDisasm->Instruction).BranchType - 0xbU < 2) {
        (pMyDisasm->Operand1).AccessMode = 1;
      }
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      BuildCompleteInstruction(pMyDisasm);
      iVar4 = (int)(pMyDisasm->Reserved_).EIP_ - (int)pMyDisasm->EIP;
    }
  }
  else {
    pMyDisasm->Error = -2;
    iVar4 = -2;
  }
  return iVar4;
}

Assistant:

int __bea_callspec__ Disasm (PDISASM pMyDisasm)
{
  if (InitVariables(pMyDisasm)) {
    (void) AnalyzeOpcode(pMyDisasm);
    pMyDisasm->Error = GV.ERROR_OPCODE;
    if (!GV.OutOfBlock) {
      if (GV.ERROR_OPCODE == UNKNOWN_OPCODE) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return UNKNOWN_OPCODE;
      }
      else {
        FixOpSizeForMemoryOperand(pMyDisasm);
        FixREXPrefixes(pMyDisasm);
        FillSegmentsRegisters(pMyDisasm);
        CompleteInstructionFields(pMyDisasm);
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return (int) (GV.EIP_-pMyDisasm->EIP);
      }
    }
    else {
      pMyDisasm->Error = OUT_OF_BLOCK;
      return OUT_OF_BLOCK;
    }
  }
  else {
    return UNKNOWN_OPCODE;
  }
}